

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O0

void Abc_SclMinsizePerform(SC_Lib *pLib,Abc_Ntk_t *p,int fUseMax,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Abc_Obj_t *pObj_00;
  int local_34;
  int gateId;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vMinCells;
  int fVerbose_local;
  int fUseMax_local;
  Abc_Ntk_t *p_local;
  SC_Lib *pLib_local;
  
  p_00 = Abc_SclFindMinAreas(pLib,fUseMax);
  Abc_SclMioGates2SclGates(pLib,p);
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_34) {
      Abc_SclSclGates2MioGates(pLib,p);
      Vec_IntFree(p_00);
      return;
    }
    pObj_00 = Abc_NtkObj(p,local_34);
    if ((((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
        (iVar1 = Abc_ObjFaninNum(pObj_00), iVar1 != 0)) &&
       (iVar1 = Abc_ObjIsBarBuf(pObj_00), iVar1 == 0)) {
      iVar1 = Vec_IntEntry(p->vGates,local_34);
      if ((iVar1 < 0) || (iVar2 = Vec_PtrSize(&pLib->vCells), iVar2 <= iVar1)) {
        __assert_fail("gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                      ,0xd6,"void Abc_SclMinsizePerform(SC_Lib *, Abc_Ntk_t *, int, int)");
      }
      iVar1 = Vec_IntEntry(p_00,iVar1);
      if ((iVar1 < 0) || (iVar2 = Vec_PtrSize(&pLib->vCells), iVar2 <= iVar1)) {
        __assert_fail("gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                      ,0xd8,"void Abc_SclMinsizePerform(SC_Lib *, Abc_Ntk_t *, int, int)");
      }
      Vec_IntWriteEntry(p->vGates,local_34,iVar1);
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Abc_SclMinsizePerform( SC_Lib * pLib, Abc_Ntk_t * p, int fUseMax, int fVerbose )
{
    Vec_Int_t * vMinCells;
    Abc_Obj_t * pObj;
    int i, gateId;
    vMinCells = Abc_SclFindMinAreas( pLib, fUseMax );
    Abc_SclMioGates2SclGates( pLib, p );
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        gateId = Vec_IntEntry( p->vGates, i );
        assert( gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells) );
        gateId = Vec_IntEntry( vMinCells, gateId );
        assert( gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells) );
        Vec_IntWriteEntry( p->vGates, i, gateId );
    }
    Abc_SclSclGates2MioGates( pLib, p );
    Vec_IntFree( vMinCells );
}